

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

void cod_ffs_write(cod_exec_context ec,FFSFile fname,int queue,int index)

{
  FMFormat p_Var1;
  event_item *peVar2;
  int iVar3;
  ev_state_data *ev_state;
  queue_item *pqVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  event_item *peVar7;
  char *__ptr;
  size_t sStack_40;
  
  ev_state = (ev_state_data *)cod_get_client_data(ec,0x34567890);
  pqVar4 = cod_find_index_rel(ev_state,queue,index);
  if (pqVar4 == (queue_item *)0x0) {
    __ptr = "No corresponding item in the queue\n";
    sStack_40 = 0x23;
  }
  else {
    p_Var1 = pqVar4->item->reference_format;
    uVar5 = FMContext_of_file(fname);
    puVar6 = (undefined8 *)format_list_of_FMFormat(p_Var1);
    uVar5 = FMregister_data_format(uVar5,puVar6);
    peVar2 = pqVar4->item;
    peVar7 = peVar2;
    if (peVar2->attrs == (attr_list)0x0) {
      printf("There is no attr for: %s\n",*puVar6);
      peVar7 = pqVar4->item;
    }
    if (peVar7->event_encoded == 0) {
      iVar3 = write_FFSfile_attrs(fname,uVar5,peVar7->decoded_event,peVar2->attrs);
      if (iVar3 != 0) {
        return;
      }
      __ptr = "Error in writing FFS_file!\n";
      sStack_40 = 0x1b;
    }
    else {
      __ptr = "Event is encoded, have not handled this case.  Can not write to file\n";
      sStack_40 = 0x45;
    }
  }
  fwrite(__ptr,sStack_40,1,_stderr);
  return;
}

Assistant:

static void
cod_ffs_write(cod_exec_context ec, FFSFile fname,  int queue, int index)
{
    FMFormat ref_format, file_format;
    struct ev_state_data * ev_state = (void*)cod_get_client_data(ec, 0x34567890);
    queue_item * my_item = cod_find_index(0, ev_state, queue, index);
    FMContext fmc;
    attr_list *temp_attr;
    FMStructDescList format_list;

    if(!my_item) {
	fprintf(stderr, "No corresponding item in the queue\n");
	return;
    }

    ref_format = my_item->item->reference_format;
    fmc = FMContext_of_file(fname);

    format_list = format_list_of_FMFormat(ref_format);
    file_format = FMregister_data_format(fmc, format_list);
    
    temp_attr = &my_item->item->attrs;
    if(!*temp_attr) {
	printf("There is no attr for: %s\n", format_list->format_name);
    }
    
    if(my_item->item->event_encoded) {
	fprintf(stderr, "Event is encoded, have not handled this case.  Can not write to file\n");
	return;
    } else {
	void * temp_data = my_item->item->decoded_event;
	if(!write_FFSfile_attrs(fname, file_format, temp_data, *temp_attr))
	    fprintf(stderr, "Error in writing FFS_file!\n");
    }
    return;
}